

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O1

NodePosi __thiscall
QuadList<SSTableDataEntry>::insertAfterAbove
          (QuadList<SSTableDataEntry> *this,SSTableDataEntry *data,NodePosi pred_node,
          NodePosi below_node)

{
  pointer pcVar1;
  QuadListNode<SSTableDataEntry> *pQVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  time_t tVar7;
  longlong lVar8;
  size_t sVar9;
  bool bVar10;
  undefined3 uVar11;
  NodePosi pQVar12;
  long *local_58;
  long local_50;
  long local_48 [3];
  
  pQVar12 = (NodePosi)operator_new(0x60);
  bVar10 = data->delete_flag;
  uVar11 = *(undefined3 *)&data->field_0x1;
  uVar3 = *(undefined4 *)&data->field_0x4;
  tVar7 = data->timestamp;
  uVar4 = *(undefined4 *)((long)&data->timestamp + 4);
  lVar8 = data->key;
  uVar5 = *(undefined4 *)((long)&data->key + 4);
  sVar9 = data->value_length;
  uVar6 = *(undefined4 *)((long)&data->value_length + 4);
  pcVar1 = (data->value)._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (data->value)._M_string_length);
  *(int *)&(pQVar12->data).key = (int)lVar8;
  *(undefined4 *)((long)&(pQVar12->data).key + 4) = uVar5;
  *(int *)&(pQVar12->data).value_length = (int)sVar9;
  *(undefined4 *)((long)&(pQVar12->data).value_length + 4) = uVar6;
  (pQVar12->data).delete_flag = bVar10;
  *(undefined3 *)&(pQVar12->data).field_0x1 = uVar11;
  *(undefined4 *)&(pQVar12->data).field_0x4 = uVar3;
  *(int *)&(pQVar12->data).timestamp = (int)tVar7;
  *(undefined4 *)((long)&(pQVar12->data).timestamp + 4) = uVar4;
  (pQVar12->data).value._M_dataplus._M_p = (pointer)&(pQVar12->data).value.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pQVar12->data).value,local_58,local_50 + (long)local_58);
  pQVar12->above = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar12->below = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar12->pred = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar12->succ = (QuadListNode<SSTableDataEntry> *)0x0;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  pQVar2 = pred_node->succ;
  pQVar12->pred = pred_node;
  pQVar12->succ = pQVar2;
  pQVar2->pred = pQVar12;
  pred_node->succ = pQVar12;
  if (below_node != (NodePosi)0x0) {
    pQVar12->below = below_node;
    below_node->above = pQVar12;
  }
  this->_size = this->_size + 1;
  return pQVar12;
}

Assistant:

auto QuadList<T>::insertAfterAbove(T data, NodePosi pred_node, NodePosi below_node) {
    auto *new_node = new Node(data);
    pred_node->insertAfterSucc(new_node, below_node);
    _size++;
    return const_cast<const NodePosi &>(new_node);
}